

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  _Rb_tree_header *p_Var1;
  pointer pbVar2;
  long lVar3;
  const_iterator cVar4;
  ostream *poVar5;
  _Rb_tree_node_base *p_Var6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pos_arg;
  pointer pbVar7;
  parser cmdl;
  key_type local_158;
  undefined1 *local_138;
  long local_130;
  undefined1 local_128 [16];
  parser local_118;
  
  local_118.params_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_118.params_._M_t._M_impl.super__Rb_tree_header._M_header;
  local_118.args_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_118.args_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_118.args_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_118.params_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_118.params_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &local_118.flags_._M_t._M_impl.super__Rb_tree_header;
  local_118.flags_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_118.flags_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_118.params_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_118.pos_args_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_118.pos_args_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_118.pos_args_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_118.flags_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_118.registeredParams_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_118.registeredParams_._M_t._M_impl.super__Rb_tree_header._M_header;
  local_118.registeredParams_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_118.registeredParams_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  local_118.registeredParams_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_118.empty_._M_dataplus._M_p = (pointer)&local_118.empty_.field_2;
  local_118.empty_._M_string_length = 0;
  local_118.empty_.field_2._M_local_buf[0] = '\0';
  local_118.params_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_118.params_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_118.flags_._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_118.flags_._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  local_118.registeredParams_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_118.registeredParams_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  argh::parser::parse(&local_118,argc,argv,2);
  local_138 = local_128;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"-v","");
  lVar3 = std::__cxx11::string::find_first_not_of((char)&local_138,0x2d);
  if (lVar3 == -1) {
    local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_158,local_138,local_138 + local_130);
  }
  else {
    std::__cxx11::string::substr((ulong)&local_158,(ulong)&local_138);
  }
  cVar4 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::find(&local_118.flags_._M_t,&local_158);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != &local_158.field_2) {
    operator_delete(local_158._M_dataplus._M_p);
  }
  if (local_138 != local_128) {
    operator_delete(local_138);
  }
  if (p_Var1 != (_Rb_tree_header *)cVar4._M_node) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Verbose, I am.",0xe);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
    std::ostream::put(-0x18);
    std::ostream::flush();
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Positional args:\n",0x11);
  pbVar2 = local_118.pos_args_.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar7 = local_118.pos_args_.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pbVar7 != pbVar2; pbVar7 = pbVar7 + 1) {
    local_158._M_dataplus._M_p._1_7_ = (undefined7)((ulong)local_158._M_dataplus._M_p >> 8);
    local_158._M_dataplus._M_p._0_1_ = 9;
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)&local_158,1);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,(pbVar7->_M_dataplus)._M_p,pbVar7->_M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Positional args:\n",0x11);
  pbVar2 = local_118.pos_args_.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar7 = local_118.pos_args_.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pbVar7 != pbVar2; pbVar7 = pbVar7 + 1) {
    local_158._M_dataplus._M_p._1_7_ = (undefined7)((ulong)local_158._M_dataplus._M_p >> 8);
    local_158._M_dataplus._M_p._0_1_ = 9;
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)&local_158,1);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,(pbVar7->_M_dataplus)._M_p,pbVar7->_M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\nFlags:\n",8);
  for (p_Var6 = local_118.flags_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var6 != p_Var1;
      p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6)) {
    local_158._M_dataplus._M_p._1_7_ = (undefined7)((ulong)local_158._M_dataplus._M_p >> 8);
    local_158._M_dataplus._M_p._0_1_ = 9;
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)&local_158,1);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,*(char **)(p_Var6 + 1),(long)p_Var6[1]._M_parent);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\nParameters:\n",0xd);
  for (p_Var6 = local_118.params_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var6 != &local_118.params_._M_t._M_impl.super__Rb_tree_header;
      p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6)) {
    local_158._M_dataplus._M_p._1_7_ = (undefined7)((ulong)local_158._M_dataplus._M_p >> 8);
    local_158._M_dataplus._M_p._0_1_ = 9;
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)&local_158,1);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,*(char **)(p_Var6 + 1),(long)p_Var6[1]._M_parent);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," : ",3);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,*(char **)(p_Var6 + 2),(long)p_Var6[2]._M_parent);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118.empty_._M_dataplus._M_p != &local_118.empty_.field_2) {
    operator_delete(local_118.empty_._M_dataplus._M_p);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_118.registeredParams_._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_118.flags_._M_t);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_118.pos_args_);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_118.params_._M_t);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_118.args_);
  return 0;
}

Assistant:

int main(int argc, char* argv[])
{
    argh::parser cmdl;
    cmdl.parse(argc, argv, argh::parser::PREFER_PARAM_FOR_UNREG_OPTION);

    if (cmdl["-v"])
        cout << "Verbose, I am." << endl;

	 cout << "Positional args:\n";
	 for (auto& pos_arg : cmdl)
		 cout << '\t' << pos_arg << endl;

    cout << "Positional args:\n";
    for (auto& pos_arg : cmdl.pos_args())
        cout << '\t' << pos_arg << endl;

    cout << "\nFlags:\n";
    for (auto& flag : cmdl.flags())
        cout << '\t' << flag << endl;

    cout << "\nParameters:\n";
    for (auto& param : cmdl.params())
        cout << '\t' << param.first << " : " << param.second << endl;

    return EXIT_SUCCESS;
}